

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withPrefix64k(char *source,char *dest,int compressedSize,int maxOutputSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort *puVar9;
  int iVar10;
  ulong uVar11;
  size_t __n;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  char cVar16;
  ushort *puVar17;
  char *pcVar18;
  BYTE *d;
  char *pcVar19;
  ulong uVar20;
  long lStack_60;
  int local_58;
  
  puVar17 = (ushort *)0xffffffffffffffff;
  iVar10 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar17 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      uVar11 = (ulong)(uint)maxOutputSize;
      pcVar1 = dest + (uVar11 - 7);
      lVar12 = 0;
      puVar17 = (ushort *)source;
LAB_00114300:
      do {
        pcVar19 = dest + lVar12;
        puVar9 = (ushort *)((long)puVar17 + 1);
        bVar4 = (byte)*puVar17;
        __n = (size_t)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          lStack_60 = -1;
          if (puVar9 < pbVar2 + -0xf) {
            lStack_60 = 0;
            puVar17 = puVar17 + 1;
            do {
              puVar9 = puVar17;
              if (pbVar2 + -0xf < puVar9) {
                lStack_60 = -1;
                break;
              }
              lStack_60 = lStack_60 + (ulong)*(byte *)((long)puVar9 + -1);
              puVar17 = (ushort *)((long)puVar9 + 1);
            } while ((ulong)*(byte *)((long)puVar9 + -1) == 0xff);
          }
          puVar17 = puVar9;
          cVar16 = '\x05';
          __n = 0xf;
          if ((lStack_60 != -1) && (__n = lStack_60 + 0xf, !CARRY8((ulong)pcVar19,__n))) {
            cVar16 = CARRY8((ulong)puVar17,__n) * '\x05';
          }
          puVar9 = puVar17;
          if (cVar16 != '\0') {
            if (cVar16 != '\x05') goto LAB_001145d5;
            goto LAB_001145d0;
          }
LAB_0011437a:
          puVar17 = puVar9;
          uVar15 = lVar12 + __n;
          if ((dest + (uVar11 - 0xc) < dest + uVar15) ||
             (puVar9 = (ushort *)((long)puVar17 + __n), pbVar2 + -8 < puVar9)) {
            if (((byte *)((long)puVar17 + __n) != pbVar2) || ((long)uVar11 < (long)uVar15))
            goto LAB_001145d0;
            memmove(pcVar19,puVar17,__n);
            puVar17 = (ushort *)(uVar15 & 0xffffffff);
            goto LAB_001145d5;
          }
          do {
            *(undefined8 *)pcVar19 = *(undefined8 *)puVar17;
            pcVar19 = pcVar19 + 8;
            puVar17 = puVar17 + 4;
          } while (pcVar19 < dest + uVar15);
          uVar5 = *puVar9;
          puVar17 = puVar9 + 1;
          lVar12 = uVar15 - uVar5;
          uVar20 = (ulong)(bVar4 & 0xf);
        }
        else {
          if ((source + (long)compressedSize + -0x10 <= puVar9) ||
             (dest + (uVar11 - 0x20) < pcVar19)) goto LAB_0011437a;
          uVar7 = *(undefined8 *)((long)puVar17 + 9);
          *(undefined8 *)pcVar19 = *(undefined8 *)puVar9;
          *(undefined8 *)(pcVar19 + 8) = uVar7;
          uVar15 = lVar12 + __n;
          uVar20 = (ulong)(bVar4 & 0xf);
          puVar17 = (ushort *)((long)puVar9 + __n) + 1;
          uVar5 = *(ushort *)((long)puVar9 + __n);
          lVar12 = uVar15 - uVar5;
          if (7 < uVar5 && uVar20 != 0xf) {
            *(undefined8 *)(dest + uVar15) = *(undefined8 *)(dest + lVar12);
            *(undefined8 *)(dest + uVar15 + 8) = *(undefined8 *)(dest + lVar12 + 8);
            *(undefined2 *)(dest + uVar15 + 0x10) = *(undefined2 *)(dest + lVar12 + 0x10);
            lVar12 = uVar15 + uVar20 + 4;
            goto LAB_00114300;
          }
        }
        pcVar19 = dest + uVar15;
        if ((int)uVar20 == 0xf) {
          lStack_60 = 0;
          puVar9 = puVar17;
          do {
            puVar17 = (ushort *)((long)puVar9 + 1);
            if (pbVar2 + -4 < puVar17) {
              lStack_60 = -1;
              break;
            }
            uVar8 = *puVar9;
            lStack_60 = lStack_60 + (ulong)(byte)uVar8;
            puVar9 = puVar17;
          } while ((ulong)(byte)uVar8 == 0xff);
          uVar20 = lStack_60 + 0xf;
          if ((lStack_60 == -1) || (CARRY8((ulong)pcVar19,uVar20))) goto LAB_001145d0;
        }
        if (lVar12 < -0x10000) goto LAB_001145d0;
        pcVar13 = dest + lVar12;
        if (uVar5 < 8) {
          pcVar19[0] = '\0';
          pcVar19[1] = '\0';
          pcVar19[2] = '\0';
          pcVar19[3] = '\0';
          *pcVar19 = *pcVar13;
          pcVar19[1] = pcVar13[1];
          pcVar19[2] = pcVar13[2];
          pcVar19[3] = pcVar13[3];
          uVar6 = inc32table[uVar5];
          *(undefined4 *)(pcVar19 + 4) = *(undefined4 *)(pcVar13 + uVar6);
          pcVar13 = pcVar13 + ((ulong)uVar6 - (long)dec64table[uVar5]);
        }
        else {
          *(undefined8 *)pcVar19 = *(undefined8 *)pcVar13;
          pcVar13 = pcVar13 + 8;
        }
        lVar12 = uVar15 + uVar20 + 4;
        pcVar3 = dest + lVar12;
        pcVar14 = pcVar19 + 8;
        if (pcVar3 <= dest + (uVar11 - 0xc)) {
          *(undefined8 *)pcVar14 = *(undefined8 *)pcVar13;
          if (0x10 < uVar20 + 4) {
            pcVar19 = pcVar19 + 0x10;
            do {
              pcVar13 = pcVar13 + 8;
              *(undefined8 *)pcVar19 = *(undefined8 *)pcVar13;
              pcVar19 = pcVar19 + 8;
            } while (pcVar19 < pcVar3);
          }
          goto LAB_00114300;
        }
        iVar10 = 5;
        if (pcVar3 <= dest + (uVar11 - 5)) {
          pcVar19 = pcVar13;
          pcVar18 = pcVar14;
          if (pcVar14 < pcVar1) {
            do {
              *(undefined8 *)pcVar18 = *(undefined8 *)pcVar19;
              pcVar18 = pcVar18 + 8;
              pcVar19 = pcVar19 + 8;
            } while (pcVar18 < pcVar1);
            pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar14);
            pcVar14 = pcVar1;
          }
          iVar10 = 0;
          for (; pcVar14 < pcVar3; pcVar14 = pcVar14 + 1) {
            cVar16 = *pcVar13;
            pcVar13 = pcVar13 + 1;
            *pcVar14 = cVar16;
          }
        }
      } while (iVar10 == 0);
      if (iVar10 == 5) {
LAB_001145d0:
        local_58 = (int)source;
        puVar17 = (ushort *)(ulong)(~(uint)puVar17 + local_58);
      }
    }
LAB_001145d5:
    iVar10 = (int)puVar17;
  }
  return iVar10;
}

Assistant:

LZ4_FORCE_O2 /* Exported, an obsolete API function. */
int LZ4_decompress_safe_withPrefix64k(const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}